

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O0

bool __thiscall Gluco::SimpSolver::eliminateVar(SimpSolver *this,Var v)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Lit p;
  char *pcVar5;
  vec<unsigned_int> *pvVar6;
  uint *puVar7;
  Clause *pCVar8;
  Clause *pCVar9;
  vec<Gluco::Solver::Watcher> *pvVar10;
  vec<unsigned_int> *local_d0;
  Lit local_94;
  int local_90;
  Lit local_8c;
  Lit local_88;
  Lit local_84;
  vec<Gluco::Lit> *local_80;
  vec<Gluco::Lit> *resolvent;
  int local_70;
  undefined4 local_6c;
  int local_68;
  int local_64;
  int clause_size;
  int cnt;
  undefined1 local_50 [8];
  vec<unsigned_int> neg;
  vec<unsigned_int> pos;
  vec<unsigned_int> *cls;
  int local_20;
  int j;
  int i;
  Var v_local;
  SimpSolver *this_local;
  
  j = v;
  _i = this;
  pcVar5 = vec<char>::operator[](&this->frozen,v);
  if (*pcVar5 != '\0') {
    __assert_fail("!frozen[v]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                  ,0x1f1,"bool Gluco::SimpSolver::eliminateVar(Var)");
  }
  bVar1 = isEliminated(this,j);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!isEliminated(v)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                  ,0x1f2,"bool Gluco::SimpSolver::eliminateVar(Var)");
  }
  cls._3_1_ = Solver::value(&this->super_Solver,j);
  lbool::lbool((lbool *)((long)&cls + 2),'\x02');
  bVar1 = lbool::operator==((lbool *)((long)&cls + 3),cls._2_1_);
  if (!bVar1) {
    __assert_fail("value(v) == l_Undef",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/glucose/SimpSolver.cpp"
                  ,499,"bool Gluco::SimpSolver::eliminateVar(Var)");
  }
  pvVar6 = OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::lookup
                     (&this->occurs,&j);
  vec<unsigned_int>::vec((vec<unsigned_int> *)&neg.sz);
  vec<unsigned_int>::vec((vec<unsigned_int> *)local_50);
  for (local_20 = 0; iVar3 = local_20, iVar2 = vec<unsigned_int>::size(pvVar6), iVar3 < iVar2;
      local_20 = local_20 + 1) {
    puVar7 = vec<unsigned_int>::operator[](pvVar6,local_20);
    pCVar8 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar7);
    clause_size = (int)mkLit(j,false);
    bVar1 = find<Gluco::Clause,Gluco::Lit>(pCVar8,(Lit *)&clause_size);
    if (bVar1) {
      local_d0 = (vec<unsigned_int> *)&neg.sz;
    }
    else {
      local_d0 = (vec<unsigned_int> *)local_50;
    }
    puVar7 = vec<unsigned_int>::operator[](pvVar6,local_20);
    vec<unsigned_int>::push(local_d0,puVar7);
  }
  local_64 = 0;
  local_68 = 0;
  local_20 = 0;
  do {
    iVar3 = local_20;
    iVar2 = vec<unsigned_int>::size((vec<unsigned_int> *)&neg.sz);
    if (iVar2 <= iVar3) {
      pcVar5 = vec<char>::operator[](&this->eliminated,j);
      *pcVar5 = '\x01';
      Solver::setDecisionVar(&this->super_Solver,j,false);
      this->eliminated_vars = this->eliminated_vars + 1;
      iVar3 = vec<unsigned_int>::size((vec<unsigned_int> *)&neg.sz);
      iVar2 = vec<unsigned_int>::size((vec<unsigned_int> *)local_50);
      if (iVar2 < iVar3) {
        for (local_20 = 0; iVar3 = local_20,
            iVar4 = vec<unsigned_int>::size((vec<unsigned_int> *)local_50), iVar2 = j, iVar3 < iVar4
            ; local_20 = local_20 + 1) {
          puVar7 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)local_50,local_20);
          pCVar8 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar7);
          mkElimClause(&this->elimclauses,iVar2,pCVar8);
        }
        local_70 = (int)mkLit(j,false);
        mkElimClause(&this->elimclauses,(Lit)local_70);
        iVar3 = vec<unsigned_int>::size((vec<unsigned_int> *)local_50);
        this->eliminated_clauses = iVar3 + this->eliminated_clauses;
      }
      else {
        for (local_20 = 0; iVar3 = local_20,
            iVar4 = vec<unsigned_int>::size((vec<unsigned_int> *)&neg.sz), iVar2 = j, iVar3 < iVar4;
            local_20 = local_20 + 1) {
          puVar7 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)&neg.sz,local_20);
          pCVar8 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar7);
          mkElimClause(&this->elimclauses,iVar2,pCVar8);
        }
        resolvent._0_4_ = mkLit(j,false);
        resolvent._4_4_ = operator~(resolvent._0_4_);
        mkElimClause(&this->elimclauses,resolvent._4_4_);
        iVar3 = vec<unsigned_int>::size((vec<unsigned_int> *)&neg.sz);
        this->eliminated_clauses = iVar3 + this->eliminated_clauses;
      }
      local_80 = &(this->super_Solver).add_tmp;
      for (local_20 = 0; iVar3 = local_20,
          iVar2 = vec<unsigned_int>::size((vec<unsigned_int> *)&neg.sz), iVar3 < iVar2;
          local_20 = local_20 + 1) {
        for (cls._4_4_ = 0; iVar3 = cls._4_4_,
            iVar2 = vec<unsigned_int>::size((vec<unsigned_int> *)local_50), iVar3 < iVar2;
            cls._4_4_ = cls._4_4_ + 1) {
          puVar7 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)&neg.sz,local_20);
          pCVar8 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar7);
          puVar7 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)local_50,cls._4_4_);
          pCVar9 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar7);
          bVar1 = merge(this,pCVar8,pCVar9,j,local_80);
          if ((bVar1) && (bVar1 = addClause_(this,local_80), !bVar1)) {
            this_local._7_1_ = false;
            goto LAB_0073bb4f;
          }
        }
      }
      for (local_20 = 0; iVar3 = local_20, iVar2 = vec<unsigned_int>::size(pvVar6), iVar3 < iVar2;
          local_20 = local_20 + 1) {
        puVar7 = vec<unsigned_int>::operator[](pvVar6,local_20);
        removeClause(this,*puVar7);
      }
      pvVar6 = OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::operator[]
                         (&this->occurs,&j);
      vec<unsigned_int>::clear(pvVar6,true);
      local_84 = mkLit(j,false);
      pvVar10 = OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>
                ::operator[](&(this->super_Solver).watches,&local_84);
      iVar3 = vec<Gluco::Solver::Watcher>::size(pvVar10);
      if (iVar3 == 0) {
        local_88 = mkLit(j,false);
        pvVar10 = OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>
                  ::operator[](&(this->super_Solver).watches,&local_88);
        vec<Gluco::Solver::Watcher>::clear(pvVar10,true);
      }
      local_90 = (int)mkLit(j,false);
      local_8c = operator~((Lit)local_90);
      pvVar10 = OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>
                ::operator[](&(this->super_Solver).watches,&local_8c);
      iVar3 = vec<Gluco::Solver::Watcher>::size(pvVar10);
      if (iVar3 == 0) {
        p = mkLit(j,false);
        local_94 = operator~(p);
        pvVar10 = OccLists<Gluco::Lit,_Gluco::vec<Gluco::Solver::Watcher>,_Gluco::Solver::WatcherDeleted>
                  ::operator[](&(this->super_Solver).watches,&local_94);
        vec<Gluco::Solver::Watcher>::clear(pvVar10,true);
      }
      this_local._7_1_ = backwardSubsumptionCheck(this,false);
LAB_0073bb4f:
      local_6c = 1;
      vec<unsigned_int>::~vec((vec<unsigned_int> *)local_50);
      vec<unsigned_int>::~vec((vec<unsigned_int> *)&neg.sz);
      return (bool)(this_local._7_1_ & 1);
    }
    for (cls._4_4_ = 0; iVar3 = cls._4_4_,
        iVar2 = vec<unsigned_int>::size((vec<unsigned_int> *)local_50), iVar3 < iVar2;
        cls._4_4_ = cls._4_4_ + 1) {
      puVar7 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)&neg.sz,local_20);
      pCVar8 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar7);
      puVar7 = vec<unsigned_int>::operator[]((vec<unsigned_int> *)local_50,cls._4_4_);
      pCVar9 = ClauseAllocator::operator[](&(this->super_Solver).ca,*puVar7);
      bVar1 = merge(this,pCVar8,pCVar9,j,&local_68);
      if (bVar1) {
        iVar3 = local_64 + 1;
        local_64 = iVar3;
        iVar2 = vec<unsigned_int>::size(pvVar6);
        if ((iVar2 + this->grow < iVar3) ||
           ((this->clause_lim != -1 && (this->clause_lim < local_68)))) {
          this_local._7_1_ = true;
          goto LAB_0073bb4f;
        }
      }
    }
    local_20 = local_20 + 1;
  } while( true );
}

Assistant:

bool SimpSolver::eliminateVar(Var v)
{
    int i, j;
    assert(!frozen[v]);
    assert(!isEliminated(v));
    assert(value(v) == l_Undef);

    // Split the occurrences into positive and negative:
    //
    const vec<CRef>& cls = occurs.lookup(v);
    vec<CRef>        pos, neg;
    for (i = 0; i < cls.size(); i++)
        (find(ca[cls[i]], mkLit(v)) ? pos : neg).push(cls[i]);

    // Check wether the increase in number of clauses stays within the allowed ('grow'). Moreover, no
    // clause must exceed the limit on the maximal clause size (if it is set):
    //
    int cnt         = 0;
    int clause_size = 0;

    for (i = 0; i < pos.size(); i++)
        for (j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, clause_size) && 
                (++cnt > cls.size() + grow || (clause_lim != -1 && clause_size > clause_lim)))
                return true;

    // Delete and store old clauses:
    eliminated[v] = true;
    setDecisionVar(v, false);
    eliminated_vars++;

    if (pos.size() > neg.size()){
        for (i = 0; i < neg.size(); i++)
            mkElimClause(elimclauses, v, ca[neg[i]]);
        mkElimClause(elimclauses, mkLit(v));
        eliminated_clauses += neg.size();
    }else{
        for (i = 0; i < pos.size(); i++)
            mkElimClause(elimclauses, v, ca[pos[i]]);
        mkElimClause(elimclauses, ~mkLit(v));
        eliminated_clauses += pos.size();
    }


    // Produce clauses in cross product:
    vec<Lit>& resolvent = add_tmp;
    for (i = 0; i < pos.size(); i++)
        for (j = 0; j < neg.size(); j++)
            if (merge(ca[pos[i]], ca[neg[j]], v, resolvent) && !addClause_(resolvent))
                return false;

    for (i = 0; i < cls.size(); i++)
        removeClause(cls[i]);

    // Free occurs list for this variable:
    occurs[v].clear(true);

    // Free watchers lists for this variable, if possible:
    if (watches[ mkLit(v)].size() == 0) watches[ mkLit(v)].clear(true);
    if (watches[~mkLit(v)].size() == 0) watches[~mkLit(v)].clear(true);

    return backwardSubsumptionCheck();
}